

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_assert.cc
# Opt level: O0

void boost::assertion_failed_msg(char *expr,char *msg,char *param_3,char *file,long line)

{
  long lVar1;
  char *__s;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  long local_30;
  long line_local;
  char *file_local;
  char *param_2_local;
  char *msg_local;
  char *expr_local;
  
  local_30 = line;
  line_local = (long)file;
  file_local = param_3;
  param_2_local = msg;
  msg_local = expr;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,expr,&local_51);
  lVar1 = line_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,(char *)lVar1,&local_89);
  __s = param_2_local;
  lVar1 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,__s,&local_b1);
  lf::base::AssertionFailed(&local_50,&local_88,lVar1,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  return;
}

Assistant:

void assertion_failed_msg(char const* expr, char const* msg,
                          char const* /*function*/, char const* file,
                          long line) {
  lf::base::AssertionFailed(expr, file, line, msg);  // NOLINT
}